

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerGLSL::check_atomic_image(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  SPIRVariable *pSVar2;
  SPIRVariable *var;
  allocator local_49;
  string local_48;
  SPIRType *local_28;
  SPIRType *type;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  type._4_4_ = id;
  pCStack_18 = this;
  local_28 = Compiler::expression_type(&this->super_Compiler,id);
  if (local_28->storage == Image) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_48,"GL_OES_shader_image_atomic",&local_49);
      require_extension_internal(this,&local_48);
      ::std::__cxx11::string::~string((string *)&local_48);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    pSVar2 = Compiler::maybe_get_backing_variable(&this->super_Compiler,type._4_4_);
    if ((pSVar2 != (SPIRVariable *)0x0) &&
       ((bVar1 = Compiler::has_decoration
                           (&this->super_Compiler,(ID)(pSVar2->super_IVariant).self.id,
                            DecorationNonWritable), bVar1 ||
        (bVar1 = Compiler::has_decoration
                           (&this->super_Compiler,(ID)(pSVar2->super_IVariant).self.id,
                            DecorationNonReadable), bVar1)))) {
      Compiler::unset_decoration
                (&this->super_Compiler,(ID)(pSVar2->super_IVariant).self.id,DecorationNonWritable);
      Compiler::unset_decoration
                (&this->super_Compiler,(ID)(pSVar2->super_IVariant).self.id,DecorationNonReadable);
      Compiler::force_recompile(&this->super_Compiler);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::check_atomic_image(uint32_t id)
{
	auto &type = expression_type(id);
	if (type.storage == StorageClassImage)
	{
		if (options.es && options.version < 320)
			require_extension_internal("GL_OES_shader_image_atomic");

		auto *var = maybe_get_backing_variable(id);
		if (var)
		{
			if (has_decoration(var->self, DecorationNonWritable) || has_decoration(var->self, DecorationNonReadable))
			{
				unset_decoration(var->self, DecorationNonWritable);
				unset_decoration(var->self, DecorationNonReadable);
				force_recompile();
			}
		}
		return true;
	}
	else
		return false;
}